

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigConstr.c
# Opt level: O3

Aig_Man_t * Saig_ManDupUnfoldConstrs(Aig_Man_t *pAig)

{
  uint uVar1;
  long *__ptr;
  char *__s;
  void *pvVar2;
  Vec_Ptr_t *pVVar3;
  int iVar4;
  uint uVar5;
  uint *puVar6;
  void *pvVar7;
  uint *__ptr_00;
  long lVar8;
  Aig_Man_t *pAVar9;
  size_t sVar10;
  char *__dest;
  Aig_Obj_t *pAVar11;
  Vec_Ptr_t *pVVar12;
  ulong uVar13;
  Aig_Obj_t *p1;
  long lVar14;
  long lVar15;
  long lVar16;
  int i;
  int iVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  long *plVar21;
  Vec_Ptr_t *local_50;
  uint *local_48;
  long local_40;
  Vec_Ptr_t *local_38;
  
  uVar1 = pAig->nTruePos;
  puVar6 = (uint *)malloc(0x10);
  uVar19 = 8;
  if (6 < uVar1 - 1) {
    uVar19 = (ulong)uVar1;
  }
  puVar6[1] = 0;
  uVar5 = (uint)uVar19;
  *puVar6 = uVar5;
  if (uVar5 == 0) {
    pvVar7 = (void *)0x0;
  }
  else {
    pvVar7 = malloc((long)(int)uVar5 * 8);
  }
  *(void **)(puVar6 + 2) = pvVar7;
  __ptr_00 = (uint *)malloc(0x10);
  __ptr_00[1] = 0;
  *__ptr_00 = uVar5;
  if (uVar5 == 0) {
    pvVar7 = (void *)0x0;
  }
  else {
    pvVar7 = malloc((long)(int)uVar5 << 3);
  }
  *(void **)(__ptr_00 + 2) = pvVar7;
  if ((int)uVar1 < 1) {
LAB_006500c2:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  lVar15 = 0;
  uVar20 = uVar19;
  do {
    iVar18 = (int)lVar15;
    if (pAig->vCos->nSize <= iVar18) goto LAB_006500c2;
    iVar4 = Saig_ManDetectConstr(pAig,iVar18,&local_38,&local_50);
    pVVar12 = local_38;
    iVar17 = (int)uVar20;
    if (iVar4 == 0) {
      if (local_38 != (Vec_Ptr_t *)0x0) {
        if (local_38->pArray != (void **)0x0) {
          free(local_38->pArray);
        }
        free(local_38);
      }
      if (local_50 != (Vec_Ptr_t *)0x0) {
        if (local_50->pArray != (void **)0x0) {
          free(local_50->pArray);
        }
        free(local_50);
      }
      uVar1 = puVar6[1];
      pvVar7 = *(void **)(puVar6 + 2);
      if ((long)(int)uVar1 < 1) {
        if (pvVar7 == (void *)0x0) goto LAB_0064fd46;
      }
      else {
        lVar15 = 0;
        do {
          pvVar2 = *(void **)((long)pvVar7 + lVar15 * 8);
          if (pvVar2 != (void *)0x0) {
            if (*(void **)((long)pvVar2 + 8) != (void *)0x0) {
              free(*(void **)((long)pvVar2 + 8));
            }
            free(pvVar2);
          }
          lVar15 = lVar15 + 1;
        } while ((int)uVar1 != lVar15);
      }
      free(pvVar7);
LAB_0064fd46:
      free(puVar6);
      if (*(void **)(__ptr_00 + 2) != (void *)0x0) {
        free(*(void **)(__ptr_00 + 2));
      }
      free(__ptr_00);
      goto LAB_0064fdd1;
    }
    if (1 < (long)local_38->nSize) {
      qsort(local_38->pArray,(long)local_38->nSize,8,Saig_ManDupCompare);
    }
    if (1 < (long)local_50->nSize) {
      qsort(local_50->pArray,(long)local_50->nSize,8,Saig_ManDupCompare);
    }
    iVar4 = (int)uVar19;
    if (iVar18 == iVar4) {
      if (iVar4 < 0x10) {
        if (*(void **)(puVar6 + 2) == (void *)0x0) {
          pvVar7 = malloc(0x80);
        }
        else {
          pvVar7 = realloc(*(void **)(puVar6 + 2),0x80);
        }
        *(void **)(puVar6 + 2) = pvVar7;
        *puVar6 = 0x10;
        uVar19 = 0x10;
      }
      else {
        uVar19 = (ulong)(uint)(iVar4 * 2);
        if (*(void **)(puVar6 + 2) == (void *)0x0) {
          pvVar7 = malloc(uVar19 * 8);
        }
        else {
          pvVar7 = realloc(*(void **)(puVar6 + 2),uVar19 * 8);
        }
        *(void **)(puVar6 + 2) = pvVar7;
        *puVar6 = iVar4 * 2;
      }
    }
    else {
      pvVar7 = *(void **)(puVar6 + 2);
    }
    pVVar3 = local_50;
    puVar6[1] = iVar18 + 1;
    *(Vec_Ptr_t **)((long)pvVar7 + lVar15 * 8) = pVVar12;
    if (iVar18 == iVar17) {
      if (iVar17 < 0x10) {
        if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
          pvVar7 = malloc(0x80);
        }
        else {
          pvVar7 = realloc(*(void **)(__ptr_00 + 2),0x80);
        }
        *(void **)(__ptr_00 + 2) = pvVar7;
        *__ptr_00 = 0x10;
        uVar20 = 0x10;
      }
      else {
        uVar20 = (ulong)(uint)(iVar17 * 2);
        if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
          pvVar7 = malloc(uVar20 * 8);
        }
        else {
          pvVar7 = realloc(*(void **)(__ptr_00 + 2),uVar20 * 8);
        }
        *(void **)(__ptr_00 + 2) = pvVar7;
        *__ptr_00 = iVar17 * 2;
      }
    }
    else {
      pvVar7 = *(void **)(__ptr_00 + 2);
    }
    lVar14 = lVar15 + 1;
    __ptr_00[1] = (uint)lVar14;
    *(Vec_Ptr_t **)((long)pvVar7 + lVar15 * 8) = pVVar3;
    lVar15 = lVar14;
  } while ((int)(uint)lVar14 < pAig->nTruePos);
  __ptr = *(long **)(__ptr_00 + 2);
  lVar15 = *__ptr;
  lVar8 = 0;
  do {
    if (*(int *)(__ptr[lVar8] + 4) != 0) {
      lVar15 = __ptr[lVar8];
    }
    lVar8 = lVar8 + 1;
  } while (lVar14 != lVar8);
  pvVar7 = *(void **)(puVar6 + 2);
  lVar8 = 0;
  do {
    if (lVar14 == lVar8) goto LAB_006500c2;
    lVar16 = *(long *)((long)pvVar7 + lVar8 * 8);
    if ((*(int *)(lVar16 + 4) != 1) || ((Aig_Obj_t *)**(long **)(lVar16 + 8) != pAig->pConst1)) {
      uVar1 = *(uint *)(lVar15 + 4);
      if (uVar1 != *(uint *)(__ptr[lVar8] + 4)) {
LAB_0064fcf7:
        puts("Collected constraints are not compatible.");
        uVar1 = puVar6[1];
        if ((long)(int)uVar1 < 1) {
          if (pvVar7 == (void *)0x0) goto LAB_0064fd80;
        }
        else {
          lVar15 = 0;
          do {
            pvVar2 = *(void **)((long)pvVar7 + lVar15 * 8);
            if (pvVar2 != (void *)0x0) {
              if (*(void **)((long)pvVar2 + 8) != (void *)0x0) {
                free(*(void **)((long)pvVar2 + 8));
              }
              free(pvVar2);
            }
            lVar15 = lVar15 + 1;
          } while ((int)uVar1 != lVar15);
        }
        free(pvVar7);
LAB_0064fd80:
        free(puVar6);
        lVar15 = 0;
        do {
          pvVar7 = (void *)__ptr[lVar15];
          if (pvVar7 != (void *)0x0) {
            if (*(void **)((long)pvVar7 + 8) != (void *)0x0) {
              free(*(void **)((long)pvVar7 + 8));
            }
            free(pvVar7);
          }
          lVar15 = lVar15 + 1;
        } while (lVar14 != lVar15);
        free(__ptr);
        free(__ptr_00);
LAB_0064fdd1:
        pAVar9 = Aig_ManDupDfs(pAig);
        return pAVar9;
      }
      if (0 < (int)uVar1) {
        uVar19 = 0;
        do {
          if (*(long *)(*(long *)(lVar15 + 8) + uVar19 * 8) !=
              *(long *)(*(long *)(__ptr[lVar8] + 8) + uVar19 * 8)) goto LAB_0064fcf7;
          uVar19 = uVar19 + 1;
        } while (uVar1 != uVar19);
      }
    }
    lVar8 = lVar8 + 1;
  } while (lVar14 != lVar8);
  pAVar9 = Aig_ManStart(pAig->nObjs[6] + pAig->nObjs[5]);
  __s = pAig->pName;
  if (__s == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar10 = strlen(__s);
    __dest = (char *)malloc(sVar10 + 1);
    strcpy(__dest,__s);
  }
  pAVar9->pName = __dest;
  pAig->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)pAVar9->pConst1;
  pVVar12 = pAig->vCis;
  if (0 < pVVar12->nSize) {
    lVar8 = 0;
    do {
      pvVar7 = pVVar12->pArray[lVar8];
      pAVar11 = Aig_ObjCreateCi(pAVar9);
      *(Aig_Obj_t **)((long)pvVar7 + 0x28) = pAVar11;
      lVar8 = lVar8 + 1;
      pVVar12 = pAig->vCis;
    } while (lVar8 < pVVar12->nSize);
  }
  pVVar12 = pAig->vObjs;
  if (0 < pVVar12->nSize) {
    lVar8 = 0;
    do {
      pvVar7 = pVVar12->pArray[lVar8];
      if ((pvVar7 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar7 + 0x18) & 7) - 7)) {
        if (((ulong)pvVar7 & 1) != 0) goto LAB_006500e1;
        uVar19 = *(ulong *)((long)pvVar7 + 8) & 0xfffffffffffffffe;
        if (uVar19 == 0) {
          pAVar11 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar11 = (Aig_Obj_t *)
                    ((ulong)((uint)*(ulong *)((long)pvVar7 + 8) & 1) ^ *(ulong *)(uVar19 + 0x28));
        }
        uVar19 = *(ulong *)((long)pvVar7 + 0x10) & 0xfffffffffffffffe;
        if (uVar19 == 0) {
          p1 = (Aig_Obj_t *)0x0;
        }
        else {
          p1 = (Aig_Obj_t *)
               ((ulong)((uint)*(ulong *)((long)pvVar7 + 0x10) & 1) ^ *(ulong *)(uVar19 + 0x28));
        }
        pAVar11 = Aig_And(pAVar9,pAVar11,p1);
        *(Aig_Obj_t **)((long)pvVar7 + 0x28) = pAVar11;
        pVVar12 = pAig->vObjs;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < pVVar12->nSize);
  }
  uVar1 = puVar6[1];
  uVar19 = (ulong)(int)uVar1;
  local_48 = puVar6;
  if (0 < (long)uVar19) {
    local_40 = *(long *)(puVar6 + 2);
    uVar20 = 0;
    do {
      lVar8 = *(long *)(local_40 + uVar20 * 8);
      pAVar11 = pAVar9->pConst1;
      if (0 < *(int *)(lVar8 + 4)) {
        lVar16 = 0;
        do {
          uVar13 = *(ulong *)(*(long *)(lVar8 + 8) + lVar16 * 8);
          pAVar11 = Aig_And(pAVar9,pAVar11,
                            (Aig_Obj_t *)
                            ((ulong)((uint)uVar13 & 1) ^
                             *(ulong *)((uVar13 & 0xfffffffffffffffe) + 0x28) ^ 1));
          lVar16 = lVar16 + 1;
        } while (lVar16 < *(int *)(lVar8 + 4));
      }
      Aig_ObjCreateCo(pAVar9,pAVar11);
      uVar20 = uVar20 + 1;
    } while (uVar20 < uVar19);
  }
  iVar18 = *(int *)(lVar15 + 4);
  pAVar9->nConstrs = iVar18;
  if (0 < iVar18) {
    lVar8 = 0;
    do {
      uVar20 = *(ulong *)(*(long *)(lVar15 + 8) + lVar8 * 8);
      Aig_ObjCreateCo(pAVar9,(Aig_Obj_t *)
                             ((ulong)((uint)uVar20 & 1) ^
                             *(ulong *)((uVar20 & 0xfffffffffffffffe) + 0x28)));
      lVar8 = lVar8 + 1;
    } while (lVar8 < *(int *)(lVar15 + 4));
  }
  puVar6 = local_48;
  if (0 < pAig->nRegs) {
    iVar18 = 0;
    do {
      uVar5 = pAig->nTruePos + iVar18;
      if (((int)uVar5 < 0) || (pAig->vCos->nSize <= (int)uVar5)) goto LAB_006500c2;
      pvVar7 = pAig->vCos->pArray[uVar5];
      if (((ulong)pvVar7 & 1) != 0) {
LAB_006500e1:
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                      ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
      }
      uVar20 = *(ulong *)((long)pvVar7 + 8);
      uVar13 = uVar20 & 0xfffffffffffffffe;
      if (uVar13 == 0) {
        pAVar11 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar11 = (Aig_Obj_t *)((ulong)((uint)uVar20 & 1) ^ *(ulong *)(uVar13 + 0x28));
      }
      Aig_ObjCreateCo(pAVar9,pAVar11);
      iVar18 = iVar18 + 1;
    } while (iVar18 < pAig->nRegs);
  }
  pvVar7 = *(void **)(puVar6 + 2);
  if ((int)uVar1 < 1) {
    if (pvVar7 == (void *)0x0) goto LAB_00650046;
  }
  else {
    uVar20 = 0;
    do {
      pvVar2 = *(void **)((long)pvVar7 + uVar20 * 8);
      if (pvVar2 != (void *)0x0) {
        if (*(void **)((long)pvVar2 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar2 + 8));
        }
        free(pvVar2);
      }
      uVar20 = uVar20 + 1;
    } while (uVar19 != uVar20);
  }
  free(pvVar7);
LAB_00650046:
  free(puVar6);
  plVar21 = __ptr;
  do {
    pvVar7 = (void *)*plVar21;
    if (pvVar7 != (void *)0x0) {
      if (*(void **)((long)pvVar7 + 8) != (void *)0x0) {
        free(*(void **)((long)pvVar7 + 8));
      }
      free(pvVar7);
    }
    plVar21 = plVar21 + 1;
    lVar14 = lVar14 + -1;
  } while (lVar14 != 0);
  free(__ptr);
  free(__ptr_00);
  Aig_ManSetRegNum(pAVar9,pAig->nRegs);
  Aig_ManCleanup(pAVar9);
  Aig_ManSeqCleanup(pAVar9);
  return pAVar9;
}

Assistant:

Aig_Man_t * Saig_ManDupUnfoldConstrs( Aig_Man_t * pAig )
{
    Vec_Ptr_t * vOutsAll, * vConsAll;
    Vec_Ptr_t * vOuts, * vCons, * vCons0;
    Aig_Man_t * pAigNew;
    Aig_Obj_t * pMiter, * pObj;
    int i, k, RetValue;
    // detect constraints for each output
    vOutsAll = Vec_PtrAlloc( Saig_ManPoNum(pAig) );
    vConsAll = Vec_PtrAlloc( Saig_ManPoNum(pAig) );
    Saig_ManForEachPo( pAig, pObj, i )
    {
        RetValue = Saig_ManDetectConstr( pAig, i, &vOuts, &vCons );
        if ( RetValue == 0 )
        {
            Vec_PtrFreeP( &vOuts );
            Vec_PtrFreeP( &vCons );
            Vec_VecFree( (Vec_Vec_t *)vOutsAll );
            Vec_VecFree( (Vec_Vec_t *)vConsAll );
            return Aig_ManDupDfs( pAig );
        }
        Vec_PtrSort( vOuts, (int (*)(void))Saig_ManDupCompare );
        Vec_PtrSort( vCons, (int (*)(void))Saig_ManDupCompare );
        Vec_PtrPush( vOutsAll, vOuts );
        Vec_PtrPush( vConsAll, vCons );
    }
    // check if constraints are compatible
    vCons0 = (Vec_Ptr_t *)Vec_PtrEntry( vConsAll, 0 );
    Vec_PtrForEachEntry( Vec_Ptr_t *, vConsAll, vCons, i )
        if ( Vec_PtrSize(vCons) )
            vCons0 = vCons;
    Vec_PtrForEachEntry( Vec_Ptr_t *, vConsAll, vCons, i )
    {
        // Constant 0 outputs are always compatible (vOuts stores the negation)
        vOuts = (Vec_Ptr_t *)Vec_PtrEntry( vOutsAll, i );
        if ( Vec_PtrSize(vOuts) == 1 && (Aig_Obj_t *)Vec_PtrEntry( vOuts, 0 ) == Aig_ManConst1(pAig) )
            continue;
        if ( !Vec_PtrEqual(vCons0, vCons) )
            break;
    }
    if ( i < Vec_PtrSize(vConsAll) )
    {
        printf( "Collected constraints are not compatible.\n" );
        Vec_VecFree( (Vec_Vec_t *)vOutsAll );
        Vec_VecFree( (Vec_Vec_t *)vConsAll );
        return Aig_ManDupDfs( pAig );
    }

    // start the new manager
    pAigNew = Aig_ManStart( Aig_ManNodeNum(pAig) );
    pAigNew->pName = Abc_UtilStrsav( pAig->pName );
    // map the constant node
    Aig_ManConst1(pAig)->pData = Aig_ManConst1( pAigNew );
    // create variables for PIs
    Aig_ManForEachCi( pAig, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pAigNew );
    // add internal nodes of this frame
    Aig_ManForEachNode( pAig, pObj, i )
        pObj->pData = Aig_And( pAigNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    // transform each output
    Vec_PtrForEachEntry( Vec_Ptr_t *, vOutsAll, vOuts, i )
    {
        // AND the outputs
        pMiter = Aig_ManConst1( pAigNew );
        Vec_PtrForEachEntry( Aig_Obj_t *, vOuts, pObj, k )
            pMiter = Aig_And( pAigNew, pMiter, Aig_Not(Aig_ObjRealCopy(pObj)) );
        Aig_ObjCreateCo( pAigNew, pMiter );
    }
    // add constraints
    pAigNew->nConstrs = Vec_PtrSize(vCons0);
    Vec_PtrForEachEntry( Aig_Obj_t *, vCons0, pObj, i )
        Aig_ObjCreateCo( pAigNew, Aig_ObjRealCopy(pObj) );
    // transfer to register outputs
    Saig_ManForEachLi( pAig, pObj, i )
        Aig_ObjCreateCo( pAigNew, Aig_ObjChild0Copy(pObj) );
//    Vec_PtrFreeP( &vOuts );
//    Vec_PtrFreeP( &vCons );
    Vec_VecFree( (Vec_Vec_t *)vOutsAll );
    Vec_VecFree( (Vec_Vec_t *)vConsAll );

    Aig_ManSetRegNum( pAigNew, Aig_ManRegNum(pAig) );
    Aig_ManCleanup( pAigNew );
    Aig_ManSeqCleanup( pAigNew );
    return pAigNew;
}